

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O1

error_code __thiscall
websocketpp::connection<websocketpp::config::asio>::send_close_frame
          (connection<websocketpp::config::asio> *this,value code,string *reason,bool ack,
          bool terminal)

{
  mutex_type *__mutex;
  ushort uVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *pbVar2;
  element_type *peVar3;
  timer_handler *callback;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  undefined ***pppuVar12;
  undefined7 in_register_00000009;
  size_t __n;
  error_category *extraout_RDX;
  undefined6 in_register_00000032;
  ulong uVar13;
  error_code eVar14;
  message_ptr msg;
  stringstream s;
  undefined1 local_268 [32];
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  local_248;
  undefined1 local_238 [32];
  undefined1 local_218 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  message_ptr local_208;
  dispatch_handler local_1f8;
  undefined1 local_1d8 [24];
  code *pcStack_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  __n = CONCAT71(in_register_00000009,ack);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"send_close_frame",__n);
  if ((int)CONCAT62(in_register_00000032,code) == 0) {
    if (ack) {
      pbVar2 = (this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (this->m_remote_close_code != 0x3ed) {
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (pbVar2,0x400,"acknowledging with remote codes",__n);
        this->m_local_close_code = this->m_remote_close_code;
        goto LAB_0019346a;
      }
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (pbVar2,0x400,"acknowledging a no-status close with normal code",__n);
      this->m_local_close_code = 1000;
    }
    else {
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                ((this->m_alog).
                 super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,0x400,"closing with no status code",__n);
      this->m_local_close_code = 0x3ed;
    }
    (this->m_local_close_reason)._M_string_length = 0;
    *(this->m_local_close_reason)._M_dataplus._M_p = '\0';
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"closing with specified codes",__n);
    this->m_local_close_code = code;
LAB_0019346a:
    std::__cxx11::string::_M_assign((string *)&this->m_local_close_reason);
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Closing with code: ",0x13);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", and reason: ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,(this->m_local_close_reason)._M_dataplus._M_p,
             (this->m_local_close_reason)._M_string_length);
  pbVar2 = (this->m_alog).
           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (pbVar2,0x400,&local_248,__n);
  if ((element_type *)
      local_248.
      super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
      ._M_weak_this.
      super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)local_238) {
    operator_delete(local_248.
                    super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                    ._M_weak_this.
                    super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
  }
  message_buffer::alloc::
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::get_message(&local_248);
  if ((element_type *)
      local_248.
      super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
      ._M_weak_this.
      super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    pppuVar12 = &error::get_category()::instance;
    uVar13 = 7;
    if (error::get_category()::instance == '\0') {
      iVar9 = __cxa_guard_acquire(&error::get_category()::instance);
      if (iVar9 != 0) {
        error::get_category()::instance = &PTR__error_category_001f9400;
        pppuVar12 = &error::get_category()::instance;
        __cxa_atexit(std::_V2::error_category::~error_category,&error::get_category()::instance,
                     &__dso_handle);
        __cxa_guard_release(&error::get_category()::instance);
      }
    }
  }
  else {
    peVar3 = (this->m_processor).
             super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar1 = this->m_local_close_code;
    local_218 = (undefined1  [8])
                local_248.
                super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                ._M_weak_this.
                super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_210 = local_248.
                super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                ._M_weak_this.
                super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
    if (local_248.
        super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
        ._M_weak_this.
        super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_248.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_248.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_248.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_248.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    uVar8 = (*peVar3->_vptr_processor[0x16])
                      (peVar3,(ulong)uVar1,&this->m_local_close_reason,local_218);
    uVar13 = (ulong)uVar8;
    if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
    }
    pppuVar12 = (undefined ***)extraout_RDX;
    if (uVar8 == 0) {
      if (terminal) {
        *(code *)((long)local_248.
                        super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                        ._M_weak_this.
                        super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x76) = (code)0x1;
      }
      this->m_state = closing;
      if (ack) {
        this->m_was_clean = true;
      }
      callback = (timer_handler *)this->m_close_handshake_timeout_dur;
      if (0 < (long)callback) {
        get_shared((connection<websocketpp::config::asio> *)(local_238 + 0x10));
        local_268._16_8_ = local_238._16_8_;
        local_268._24_8_ = local_238._24_8_;
        local_238._16_16_ = ZEXT816(0) << 0x20;
        _local_1d8 = ZEXT832(0) << 0x20;
        puVar11 = (undefined8 *)operator_new(0x20);
        *puVar11 = handle_close_handshake_timeout;
        puVar11[1] = 0;
        puVar11[2] = local_268._16_8_;
        puVar11[3] = local_268._24_8_;
        local_1d8._0_8_ = puVar11;
        local_1d8._16_8_ =
             std::
             _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>_>
             ::_M_manager;
        pcStack_1c0 = std::
                      _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>_>
                      ::_M_invoke;
        transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
                  ((connection<websocketpp::config::asio::transport_config> *)local_268,(long)this,
                   callback);
        uVar6 = local_268._0_8_;
        uVar7 = local_268._8_8_;
        local_268._0_16_ = ZEXT816(0);
        this_00 = (this->m_handshake_timer).
                  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (this->m_handshake_timer).
        super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)uVar6;
        (this->m_handshake_timer).
        super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
        }
        if ((element_type *)local_1d8._16_8_ != (element_type *)0x0) {
          (*(code *)local_1d8._16_8_)(local_1d8,local_1d8,3);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._24_8_);
        }
      }
      __mutex = &this->m_write_lock;
      iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      local_208.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                local_248.
                super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                ._M_weak_this.
                super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_208.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_248.
           super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
           ._M_weak_this.
           super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_248.
          super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
          ._M_weak_this.
          super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_248.
           super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
           ._M_weak_this.
           super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_248.
                super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                ._M_weak_this.
                super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_248.
           super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
           ._M_weak_this.
           super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_248.
                super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                ._M_weak_this.
                super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      write_push(this,&local_208);
      if (local_208.
          super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (this->m_write_flag == false) {
        psVar4 = (this->m_send_queue).c.
                 super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        psVar5 = (this->m_send_queue).c.
                 super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (psVar4 != psVar5) {
          get_shared((connection<websocketpp::config::asio> *)local_268);
          local_268._16_8_ = local_268._0_8_;
          local_268._24_8_ = local_268._8_8_;
          local_268._0_16_ = ZEXT816(0) << 0x20;
          local_1f8 = (dispatch_handler)(ZEXT832(0) << 0x20);
          puVar11 = (undefined8 *)operator_new(0x20);
          *puVar11 = write_frame;
          puVar11[1] = 0;
          puVar11[2] = local_268._16_8_;
          puVar11[3] = local_268._24_8_;
          local_1f8.super__Function_base._M_functor._M_unused._M_object = puVar11;
          local_1f8.super__Function_base._M_manager =
               std::
               _Function_handler<void_(),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>_>
               ::_M_manager;
          local_1f8._M_invoker =
               std::
               _Function_handler<void_(),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>_>
               ::_M_invoke;
          transport::asio::connection<websocketpp::config::asio::transport_config>::dispatch
                    (&this->super_transport_con_type,&local_1f8);
          if (local_1f8.super__Function_base._M_manager != (code *)0x0) {
            (*local_1f8.super__Function_base._M_manager)(&local_1f8,&local_1f8,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
          }
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      uVar13 = 0;
      pppuVar12 = (undefined ***)std::_V2::system_category();
    }
  }
  if (local_248.
      super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
      ._M_weak_this.
      super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.
               super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
               ._M_weak_this.
               super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  eVar14._M_cat = (error_category *)pppuVar12;
  eVar14._0_8_ = uVar13;
  return eVar14;
}

Assistant:

lib::error_code connection<config>::send_close_frame(close::status::value code,
    std::string const & reason, bool ack, bool terminal)
{
    m_alog->write(log::alevel::devel,"send_close_frame");

    // check for special codes

    // If silent close is set, respect it and blank out close information
    // Otherwise use whatever has been specified in the parameters. If
    // parameters specifies close::status::blank then determine what to do
    // based on whether or not this is an ack. If it is not an ack just
    // send blank info. If it is an ack then echo the close information from
    // the remote endpoint.
    if (config::silent_close) {
        m_alog->write(log::alevel::devel,"closing silently");
        m_local_close_code = close::status::no_status;
        m_local_close_reason.clear();
    } else if (code != close::status::blank) {
        m_alog->write(log::alevel::devel,"closing with specified codes");
        m_local_close_code = code;
        m_local_close_reason = reason;
    } else if (!ack) {
        m_alog->write(log::alevel::devel,"closing with no status code");
        m_local_close_code = close::status::no_status;
        m_local_close_reason.clear();
    } else if (m_remote_close_code == close::status::no_status) {
        m_alog->write(log::alevel::devel,
            "acknowledging a no-status close with normal code");
        m_local_close_code = close::status::normal;
        m_local_close_reason.clear();
    } else {
        m_alog->write(log::alevel::devel,"acknowledging with remote codes");
        m_local_close_code = m_remote_close_code;
        m_local_close_reason = m_remote_close_reason;
    }

    std::stringstream s;
    s << "Closing with code: " << m_local_close_code << ", and reason: "
      << m_local_close_reason;
    m_alog->write(log::alevel::devel,s.str());

    message_ptr msg = m_msg_manager->get_message();
    if (!msg) {
        return error::make_error_code(error::no_outgoing_buffers);
    }

    lib::error_code ec = m_processor->prepare_close(m_local_close_code,
        m_local_close_reason,msg);
    if (ec) {
        return ec;
    }

    // Messages flagged terminal will result in the TCP connection being dropped
    // after the message has been written. This is typically used when servers
    // send an ack and when any endpoint encounters a protocol error
    if (terminal) {
        msg->set_terminal(true);
    }

    m_state = session::state::closing;

    if (ack) {
        m_was_clean = true;
    }

    // Start a timer so we don't wait forever for the acknowledgement close
    // frame
    if (m_close_handshake_timeout_dur > 0) {
        m_handshake_timer = transport_con_type::set_timer(
            m_close_handshake_timeout_dur,
            lib::bind(
                &type::handle_close_handshake_timeout,
                type::get_shared(),
                lib::placeholders::_1
            )
        );
    }

    bool needs_writing = false;
    {
        scoped_lock_type lock(m_write_lock);
        write_push(msg);
        needs_writing = !m_write_flag && !m_send_queue.empty();
    }

    if (needs_writing) {
        transport_con_type::dispatch(lib::bind(
            &type::write_frame,
            type::get_shared()
        ));
    }

    return lib::error_code();
}